

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O0

QuaternionT<float> __thiscall
Gs::Slerp<Gs::QuaternionT<float>,float>
          (Gs *this,QuaternionT<float> *from,QuaternionT<float> *to,float *t)

{
  float fVar1;
  float fVar2;
  double dVar3;
  QuaternionT<float> QVar4;
  float local_3c;
  float local_38;
  float scale1;
  float scale0;
  float sinom;
  float cosom;
  float omega;
  float *t_local;
  QuaternionT<float> *to_local;
  QuaternionT<float> *from_local;
  
  _cosom = t;
  t_local = &to->x;
  to_local = from;
  from_local = (QuaternionT<float> *)this;
  scale0 = Dot<Gs::QuaternionT<float>,float>(from,to);
  if (0.0 <= scale0) {
    local_3c = 1.0;
  }
  else {
    scale0 = -scale0;
    local_3c = -1.0;
  }
  fVar1 = 1.0 - scale0;
  fVar2 = std::numeric_limits<float>::epsilon();
  if (fVar1 <= fVar2) {
    local_38 = 1.0 - *_cosom;
    local_3c = *_cosom * local_3c;
  }
  else {
    dVar3 = std::acos((double)(ulong)(uint)scale0);
    sinom = SUB84(dVar3,0);
    dVar3 = std::sin((double)((ulong)dVar3 & 0xffffffff));
    scale1 = SUB84(dVar3,0);
    dVar3 = std::sin((double)(ulong)(uint)((1.0 - *_cosom) * sinom));
    local_38 = SUB84(dVar3,0) / scale1;
    dVar3 = std::sin((double)(ulong)(uint)(*_cosom * sinom));
    local_3c = (SUB84(dVar3,0) / scale1) * local_3c;
  }
  QVar4 = Mix<Gs::QuaternionT<float>,float>
                    (this,to_local,(QuaternionT<float> *)t_local,&local_38,&local_3c);
  return QVar4;
}

Assistant:

TVector Slerp(const TVector& from, const TVector& to, const TScalar& t)
{
    TScalar omega, cosom, sinom;
    TScalar scale0, scale1;

    /* Calculate cosine */
    cosom = Dot<TVector, TScalar>(from, to);

    /* Adjust signs (if necessary) */
    if (cosom < TScalar(0))
    {
        cosom = -cosom;
        scale1 = TScalar(-1);
    }
    else
        scale1 = TScalar(1);

    /* Calculate coefficients */
    if ((TScalar(1) - cosom) > std::numeric_limits<TScalar>::epsilon())
    {
        /* Standard case (slerp) */
        omega = std::acos(cosom);
        sinom = std::sin(omega);
        scale0 = std::sin((TScalar(1) - t) * omega) / sinom;
        scale1 *= std::sin(t * omega) / sinom;
    }
    else
    {
        /* 'from' and 'to' quaternions are very close, so we can do a linear interpolation */
        scale0 = TScalar(1) - t;
        scale1 *= t;
    }

    /* Calculate final values */
    return Mix(from, to, scale0, scale1);
}